

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O0

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<11,_0,_13,_0,_13>::evaluate
               (ShaderEvalContext *evalCtx)

{
  int in_ECX;
  VecAccess<float,_4,_3> local_108;
  Mat4 local_dc;
  Mat4 local_9c;
  Matrix<float,_4,_4> local_5c;
  Vector<float,_3> local_1c;
  ShaderEvalContext *local_10;
  ShaderEvalContext *evalCtx_local;
  
  local_10 = evalCtx;
  getInputValue<0,13>(&local_9c,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)0x0,in_ECX);
  getInputValue<0,13>(&local_dc,(MatrixCaseUtils *)local_10,(ShaderEvalContext *)0x1,in_ECX);
  tcu::operator+(&local_5c,&local_9c,&local_dc);
  reduceToVec3((MatrixCaseUtils *)&local_1c,&local_5c);
  tcu::Vector<float,_4>::xyz(&local_108,&local_10->color);
  tcu::VecAccess<float,_4,_3>::operator=(&local_108,&local_1c);
  tcu::Matrix<float,_4,_4>::~Matrix(&local_5c);
  tcu::Matrix<float,_4,_4>::~Matrix(&local_dc);
  tcu::Matrix<float,_4,_4>::~Matrix(&local_9c);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		evalCtx.color.xyz() = reduceToVec3(getInputValue<In0Type, In0DataType>(evalCtx, 0) + getInputValue<In1Type, In1DataType>(evalCtx, 1));
	}